

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong helper_raddu_l_ob_mips64el(target_ulong rs)

{
  uint local_24;
  target_ulong tStack_20;
  uint i;
  DSP64Value ds;
  target_ulong ret;
  target_ulong rs_local;
  
  ds = (DSP64Value)0x0;
  tStack_20 = rs;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    ds.ub = (ulong)*(byte *)((long)&stack0xffffffffffffffe0 + (ulong)local_24) + ds.ub;
  }
  return (target_ulong)ds;
}

Assistant:

target_ulong helper_raddu_l_ob(target_ulong rs)
{
    target_ulong ret = 0;
    DSP64Value ds;
    unsigned int i;

    ds.ul[0] = rs;
    for (i = 0; i < 8; i++) {
        ret += ds.ub[i];
    }
    return ret;
}